

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaTargetGenerator::WriteObjectBuildStatements(cmNinjaTargetGenerator *this)

{
  _Rb_tree_node_base *lang;
  pointer *pppcVar1;
  Value *this_00;
  cmGeneratedFileStream *pcVar2;
  pointer pcVar3;
  cmMakefile *this_01;
  iterator __position;
  cmCustomCommand *cc_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  cmGeneratorTarget *this_02;
  long lVar6;
  pointer pbVar7;
  pointer pbVar8;
  bool bVar9;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar10;
  char *pcVar11;
  size_t sVar12;
  string *psVar13;
  ostream *poVar14;
  long *plVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar17;
  MapToNinjaPathImpl MVar18;
  ulong uVar19;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmGlobalNinjaGenerator *pcVar20;
  _Base_ptr p_Var21;
  undefined8 *puVar22;
  Value *pVVar23;
  cmSourceFile **ppcVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  size_type *psVar26;
  ValueHolder VVar27;
  undefined1 auVar28 [8];
  pointer ppcVar29;
  cmCustomCommand *cc;
  string targetSwiftDepsPath;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string mapFilePath;
  string local_460;
  _Rb_tree_node_base *local_440;
  ValueHolder local_438;
  undefined8 *puStack_430;
  cmSourceFile *local_428;
  long lStack_420;
  string *local_390;
  string local_388;
  string local_368;
  string local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined1 local_308 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  pointer local_2c8;
  pointer pbStack_2c0;
  pointer local_2b8;
  pointer pbStack_2b0;
  pointer local_2a8;
  pointer pbStack_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  pointer pbStack_280;
  pointer local_278;
  pointer pbStack_270;
  cmNinjaDeps local_268;
  _Rb_tree_node_base local_248;
  size_t local_228;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [21];
  string local_c0;
  string local_a0;
  Value local_80;
  Value local_58;
  
  pcVar10 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  cmGlobalNinjaGenerator::WriteDivider
            ((ostream *)
             (pcVar10->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
  pcVar10 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  pcVar2 = (pcVar10->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# Object build statements for ",0x1e);
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar11 = cmState::GetTargetTypeName(targetType);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear((int)pcVar2 +
                    (int)(pcVar2->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>
                         ._vptr_basic_ostream[0xfffffffffffffffd]);
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,pcVar11,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2," target ",8);
  psVar13 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_308 = (undefined1  [8])&local_2f8;
  pcVar3 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar3,pcVar3 + psVar13->_M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pcVar2,(char *)local_308,(long)paStack_300);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n\n",2);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  this_01 = (this->super_cmCommonTargetGenerator).Makefile;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"CMAKE_BUILD_TYPE","");
  local_390 = cmMakefile::GetSafeDefinition(this_01,(string *)local_308);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  local_308 = (undefined1  [8])0x0;
  paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_2f8._M_allocated_capacity = 0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_308,
             local_390);
  paVar25 = paStack_300;
  if (local_308 != (undefined1  [8])paStack_300) {
    auVar28 = local_308;
    do {
      local_438.map_ = (ObjectValues *)cmSourceFile::GetCustomCommand(*(cmSourceFile **)auVar28);
      cmLocalNinjaGenerator::AddCustomCommandTarget
                (this->LocalGenerator,(cmCustomCommand *)local_438.map_,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget);
      __position._M_current =
           (this->CustomCommands).
           super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->CustomCommands).
          super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>>::
        _M_realloc_insert<cmCustomCommand_const*const&>
                  ((vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>> *)
                   &this->CustomCommands,__position,(cmCustomCommand **)&local_438.map_);
      }
      else {
        *__position._M_current = (cmCustomCommand *)local_438;
        pppcVar1 = &(this->CustomCommands).
                    super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      auVar28 = (undefined1  [8])((long)auVar28 + 8);
    } while (auVar28 != (undefined1  [8])paVar25);
  }
  if (local_308 != (undefined1  [8])0x0) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity - (long)local_308);
  }
  psVar13 = local_390;
  local_308 = (undefined1  [8])0x0;
  paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_2f8._M_allocated_capacity = 0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_308,
             local_390);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            ((this->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_308,
             &((this->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType);
  if (local_308 != (undefined1  [8])0x0) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity - (long)local_308);
  }
  local_308 = (undefined1  [8])0x0;
  paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_2f8._M_allocated_capacity = 0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_308,
             psVar13);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            ((this->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_308,
             &((this->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType);
  if (local_308 != (undefined1  [8])0x0) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity - (long)local_308);
  }
  local_438.int_ = 0;
  puStack_430 = (undefined8 *)0x0;
  local_428 = (cmSourceFile *)0x0;
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_438,
             psVar13);
  puVar22 = puStack_430;
  if (local_438 != puStack_430) {
    VVar27 = local_438;
    do {
      psVar13 = cmSourceFile::GetFullPath_abi_cxx11_(*(cmSourceFile **)VVar27.string_);
      ConvertToNinjaPath((string *)local_308,this,psVar13);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Objects
                 ,(string *)local_308);
      if (local_308 != (undefined1  [8])&local_2f8) {
        operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
      }
      VVar27.string_ = (char *)&((VVar27.map_)->_M_t)._M_impl.super__Rb_tree_header;
    } while ((undefined8 *)VVar27.int_ != puVar22);
  }
  if (local_438 != (undefined8 *)0x0) {
    operator_delete(local_438.string_,(long)local_428 - (long)local_438);
  }
  local_328 = &local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"phony","");
  local_308 = (undefined1  [8])&local_2f8;
  local_2e8._M_p = (pointer)&local_2d8;
  paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_2f8._M_allocated_capacity = local_2f8._M_allocated_capacity & 0xffffffffffffff00;
  if (local_328 == &local_318) {
    local_2d8._8_8_ = local_318._8_8_;
  }
  else {
    local_2e8._M_p = (pointer)local_328;
  }
  local_2d8._M_allocated_capacity._1_7_ = local_318._M_allocated_capacity._1_7_;
  local_2d8._M_local_buf[0] = local_318._M_local_buf[0];
  local_248._M_left = &local_248;
  local_2e0 = local_320;
  local_320 = 0;
  local_318._M_local_buf[0] = '\0';
  local_248._M_color = _S_red;
  local_248._M_parent = (_Base_ptr)0x0;
  local_2c8 = (pointer)0x0;
  pbStack_2c0 = (pointer)0x0;
  local_2b8 = (pointer)0x0;
  pbStack_2b0 = (pointer)0x0;
  local_2a8 = (pointer)0x0;
  pbStack_2a0 = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbStack_280 = (pointer)0x0;
  local_278 = (pointer)0x0;
  pbStack_270 = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228 = 0;
  local_220._M_p = (pointer)local_210;
  local_218 = 0;
  local_210[0]._M_local_buf[0] = '\0';
  local_328 = &local_318;
  local_248._M_right = local_248._M_left;
  psVar13 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  pcVar3 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,pcVar3,pcVar3 + psVar13->_M_string_length);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x5627ab);
  ppcVar24 = (cmSourceFile **)(plVar15 + 2);
  if ((cmSourceFile **)*plVar15 == ppcVar24) {
    local_428 = *ppcVar24;
    lStack_420 = plVar15[3];
    local_438.string_ = (char *)&local_428;
  }
  else {
    local_428 = *ppcVar24;
    local_438.string_ = ((char *)*plVar15).string_;
  }
  puStack_430 = (undefined8 *)plVar15[1];
  *plVar15 = (long)ppcVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_308,(string *)&local_438.bool_);
  if (local_438 != &local_428) {
    operator_delete(local_438.string_,(ulong)((long)&(local_428->Location).Makefile + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  OrderDependsTargetForTarget_abi_cxx11_((string *)&local_438,this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438);
  if (local_438 != &local_428) {
    operator_delete(local_438.string_,(ulong)((long)&(local_428->Location).Makefile + 1));
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,&local_268,
             DependOnTargetOrdering);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
             local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->ExtraFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ppcVar29 = (this->CustomCommands).
             super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_440 = (_Rb_tree_node_base *)
              (this->CustomCommands).
              super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if ((_Rb_tree_node_base *)ppcVar29 != local_440) {
    do {
      cc_00 = *ppcVar29;
      psVar13 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                          (&this->super_cmCommonTargetGenerator);
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      pcVar3 = (psVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar3,pcVar3 + psVar13->_M_string_length);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&local_438,cc_00,&local_388,
                 (cmLocalGenerator *)this->LocalGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      pvVar16 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)&local_438);
      pvVar17 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)&local_438);
      _Var4._M_current =
           (pvVar16->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (pvVar16->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar18.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var4,_Var5,&local_268,MVar18);
      _Var4._M_current =
           (pvVar17->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (pvVar17->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar18.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var4,_Var5,&local_268,MVar18);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&local_438);
      ppcVar29 = ppcVar29 + 1;
    } while ((_Rb_tree_node_base *)ppcVar29 != local_440);
  }
  pbVar8 = local_268.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = local_268.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar19 = (long)local_268.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_268.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar6 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar7,pbVar8);
  }
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_268,(iterator)__first._M_current,
             (iterator)
             local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puStack_430 = (undefined8 *)0x0;
    local_428 = (cmSourceFile *)((ulong)local_428 & 0xffffffffffffff00);
    local_438.string_ = (char *)&local_428;
    psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::_M_append((char *)&local_438.int_,(ulong)(psVar13->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_438.int_);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[0xc])
              (&local_460,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    std::__cxx11::string::_M_append((char *)&local_438.int_,(ulong)local_460._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    ConvertToNinjaPath(&local_460,this,(string *)&local_438);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
               &local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_438 != &local_428) {
      operator_delete(local_438.string_,(ulong)((long)&(local_428->Location).Makefile + 1));
    }
  }
  pcVar10 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar10,(ostream *)
                     (pcVar20->BuildFileStream)._M_t.
                     super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                     .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
             (cmNinjaBuild *)local_308,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_308);
  local_308 = (undefined1  [8])0x0;
  paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_2f8._M_allocated_capacity = 0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_308,
             local_390);
  paVar25 = paStack_300;
  for (auVar28 = local_308; auVar28 != (undefined1  [8])paVar25;
      auVar28 = (undefined1  [8])((long)auVar28 + 8)) {
    WriteObjectBuildStatement(this,*(cmSourceFile **)auVar28);
  }
  if (local_308 != (undefined1  [8])0x0) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity - (long)local_308);
  }
  p_Var21 = (this->DDIFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_440 = &(this->DDIFiles)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var21 != local_440) {
    do {
      lang = p_Var21 + 1;
      LanguageDyndepRule(&local_348,this,(string *)lang);
      local_308 = (undefined1  [8])&local_2f8;
      paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_2f8._M_allocated_capacity = local_2f8._M_allocated_capacity & 0xffffffffffffff00;
      local_2e8._M_p = (pointer)&local_2d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p == &local_348.field_2) {
        local_2d8._8_8_ = local_348.field_2._8_8_;
      }
      else {
        local_2e8._M_p = local_348._M_dataplus._M_p;
      }
      local_2d8._M_allocated_capacity._1_7_ = local_348.field_2._M_allocated_capacity._1_7_;
      local_2d8._M_local_buf[0] = local_348.field_2._M_local_buf[0];
      local_2e0 = local_348._M_string_length;
      local_348._M_string_length = 0;
      local_348.field_2._M_local_buf[0] = '\0';
      local_248._M_color = _S_red;
      local_248._M_parent = (_Base_ptr)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_278 = (pointer)0x0;
      pbStack_270 = (pointer)0x0;
      local_298.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pbStack_280 = (pointer)0x0;
      local_298.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      pbStack_2a0 = (pointer)0x0;
      local_2b8 = (pointer)0x0;
      pbStack_2b0 = (pointer)0x0;
      local_2c8 = (pointer)0x0;
      pbStack_2c0 = (pointer)0x0;
      local_248._M_left = &local_248;
      local_228 = 0;
      local_220._M_p = (pointer)local_210;
      local_218 = 0;
      local_210[0]._M_local_buf[0] = '\0';
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_248._M_right = local_248._M_left;
      GetDyndepFilePath((string *)&local_438,this,(string *)lang);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438);
      if (local_438 != &local_428) {
        operator_delete(local_438.string_,(ulong)((long)&(local_428->Location).Makefile + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_298,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(p_Var21 + 2));
      WriteTargetDependInfo(this,(string *)lang);
      cmLocalNinjaGenerator::AppendTargetDepends
                (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 &local_268,DependOnTargetArtifact);
      pcVar10 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar10,(ostream *)
                         (pcVar20->BuildFileStream)._M_t.
                         super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                         .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                 (cmNinjaBuild *)local_308,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_308);
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while (p_Var21 != local_440);
  }
  pcVar10 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (pcVar10->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"\n",1);
  this_00 = &this->SwiftOutputMap;
  bVar9 = Json::Value::empty(this_00);
  if (!bVar9) {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
              ((string *)&local_438,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_438.int_);
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar25) {
      local_2f8._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_2f8._8_8_ = plVar15[3];
      local_308 = (undefined1  [8])&local_2f8;
    }
    else {
      local_2f8._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_308 = (undefined1  [8])*plVar15;
    }
    paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar15[1];
    *plVar15 = (long)paVar25;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    ConvertToNinjaPath(&local_c0,this,(string *)local_308);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if (local_438 != &local_428) {
      operator_delete(local_438.string_,(ulong)((long)&(local_428->Location).Makefile + 1));
    }
    this_02 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    local_308 = (undefined1  [8])&local_2f8;
    local_438.int_ = 0x17;
    local_308 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_308,(ulong)&local_438);
    local_2f8._M_allocated_capacity = (size_type)local_438;
    *(undefined8 *)local_308 = 0x45445f7466697753;
    *(char *)((long)local_308 + 8) = 'P';
    *(char *)((long)local_308 + 9) = 'E';
    *(char *)((long)local_308 + 10) = 'N';
    *(char *)((long)local_308 + 0xb) = 'D';
    *(char *)((long)local_308 + 0xc) = 'E';
    *(char *)((long)local_308 + 0xd) = 'N';
    *(char *)((long)local_308 + 0xe) = 'C';
    *(char *)((long)local_308 + 0xf) = 'I';
    *(char *)((long)local_308 + 0xf) = 'I';
    *(char *)((long)local_308 + 0x10) = 'E';
    *(char *)((long)local_308 + 0x11) = 'S';
    *(char *)((long)local_308 + 0x12) = '_';
    *(char *)((long)local_308 + 0x13) = 'F';
    *(char *)((long)local_308 + 0x14) = 'I';
    *(char *)((long)local_308 + 0x15) = 'L';
    *(char *)((long)local_308 + 0x16) = 'E';
    paStack_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438;
    *((long)local_308 + local_438.string_) = '\0';
    pcVar11 = cmGeneratorTarget::GetProperty(this_02,(string *)local_308);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if (pcVar11 == (char *)0x0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_a0,this_02);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_a0);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      psVar26 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar26) {
        local_460.field_2._M_allocated_capacity = *psVar26;
        local_460.field_2._8_8_ = plVar15[3];
      }
      else {
        local_460.field_2._M_allocated_capacity = *psVar26;
        local_460._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_460._M_string_length = plVar15[1];
      *plVar15 = (long)psVar26;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this_02);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_460,(ulong)(psVar13->_M_dataplus)._M_p);
      local_438.string_ = (char *)&local_428;
      ppcVar24 = (cmSourceFile **)(plVar15 + 2);
      if ((cmSourceFile **)*plVar15 == ppcVar24) {
        local_428 = *ppcVar24;
        lStack_420 = plVar15[3];
      }
      else {
        local_428 = *ppcVar24;
        local_438.string_ = ((char *)*plVar15).string_;
      }
      puStack_430 = (undefined8 *)plVar15[1];
      *plVar15 = (long)ppcVar24;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar22 = (undefined8 *)std::__cxx11::string::append((char *)&local_438.int_);
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar22 == paVar25) {
        local_2f8._M_allocated_capacity = paVar25->_M_allocated_capacity;
        local_2f8._8_8_ = puVar22[3];
        local_308 = (undefined1  [8])&local_2f8;
      }
      else {
        local_2f8._M_allocated_capacity = paVar25->_M_allocated_capacity;
        local_308 = (undefined1  [8])*puVar22;
      }
      paStack_300 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(puVar22 + 1);
      *puVar22 = paVar25;
      puVar22[1] = 0;
      *(undefined1 *)(puVar22 + 2) = 0;
      ConvertToNinjaPath(&local_368,this,(string *)local_308);
      if (local_308 != (undefined1  [8])&local_2f8) {
        operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
      }
      if (local_438 != &local_428) {
        operator_delete(local_438.string_,(ulong)((long)&(local_428->Location).Makefile + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      sVar12 = strlen(pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,pcVar11,pcVar11 + sVar12)
      ;
    }
    Json::Value::Value((Value *)&local_438,objectValue);
    Json::Value::Value(&local_58,&local_368);
    pVVar23 = Json::Value::operator[]((Value *)&local_438,"swift-dependencies");
    Json::Value::operator=(pVVar23,&local_58);
    Json::Value::~Value(&local_58);
    Json::Value::Value(&local_80,(Value *)&local_438);
    pVVar23 = Json::Value::operator[](this_00,"");
    Json::Value::operator=(pVVar23,&local_80);
    Json::Value::~Value(&local_80);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_308,&local_c0,false,None);
    Json::operator<<((ostream *)local_308,this_00);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_308);
    Json::Value::~Value((Value *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements()
{
  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  this->GetBuildFileStream()
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  {
    std::vector<cmSourceFile const*> customCommands;
    this->GeneratorTarget->GetCustomCommands(customCommands, config);
    for (cmSourceFile const* sf : customCommands) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      // Record the custom commands for this target. The container is used
      // in WriteObjectBuildStatement when called in a loop below.
      this->CustomCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->MacOSXContentGenerator.get());
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->MacOSXContentGenerator.get());
  }
  {
    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      this->Objects.push_back(this->GetSourceFilePath(sf));
    }
  }

  {
    cmNinjaBuild build("phony");
    build.Comment = "Order-only phony target for " + this->GetTargetName();
    build.Outputs.push_back(this->OrderDependsTargetForTarget());

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cmAppend(orderOnlyDeps, this->ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    for (cmCustomCommand const* cc : this->CustomCommands) {
      cmCustomCommandGenerator ccg(*cc, this->GetConfigName(),
                                   this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      std::transform(ccoutputs.begin(), ccoutputs.end(),
                     std::back_inserter(orderOnlyDeps), MapToNinjaPath());
      std::transform(ccbyproducts.begin(), ccbyproducts.end(),
                     std::back_inserter(orderOnlyDeps), MapToNinjaPath());
    }

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      // Any path that always exists will work here.  It would be nice to
      // use just "." but that is not supported by Ninja < 1.7.
      std::string tgtDir;
      tgtDir += this->LocalGenerator->GetCurrentBinaryDirectory();
      tgtDir += "/";
      tgtDir +=
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), build);
  }

  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);
    for (cmSourceFile const* sf : objectSources) {
      this->WriteObjectBuildStatement(sf);
    }
  }

  for (auto const& langDDIFiles : this->DDIFiles) {
    std::string const& language = langDDIFiles.first;
    cmNinjaDeps const& ddiFiles = langDDIFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language));
    build.Outputs.push_back(this->GetDyndepFilePath(language));
    build.ExplicitDeps = ddiFiles;

    this->WriteTargetDependInfo(language);

    // Make sure dyndep files for all our dependencies have already
    // been generated so that the '<LANG>Modules.json' files they
    // produced as side-effects are available for us to read.
    // Ideally we should depend on the '<LANG>Modules.json' files
    // from our dependencies directly, but we don't know which of
    // our dependencies produces them.  Fixing this will require
    // refactoring the Ninja generator to generate targets in
    // dependency order so that we can collect the needed information.
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, build.OrderOnlyDeps, DependOnTargetArtifact);

    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), build);
  }

  this->GetBuildFileStream() << "\n";

  if (!this->SwiftOutputMap.empty()) {
    std::string const mapFilePath = this->ConvertToNinjaPath(
      this->GeneratorTarget->GetSupportDirectory() + "/output-file-map.json");
    std::string const targetSwiftDepsPath = [this]() -> std::string {
      cmGeneratorTarget const* target = this->GeneratorTarget;
      if (const char* name = target->GetProperty("Swift_DEPENDENCIES_FILE")) {
        return name;
      }
      return this->ConvertToNinjaPath(target->GetSupportDirectory() + "/" +
                                      target->GetName() + ".swiftdeps");
    }();

    // build the global target dependencies
    // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
    Json::Value deps(Json::objectValue);
    deps["swift-dependencies"] = targetSwiftDepsPath;
    this->SwiftOutputMap[""] = deps;

    cmGeneratedFileStream output(mapFilePath);
    output << this->SwiftOutputMap;
  }
}